

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_add_entry(X509_NAME *name,X509_NAME_ENTRY *ne,int loc,int set)

{
  stack_st_X509_NAME_ENTRY *sk_00;
  int iVar1;
  size_t sVar2;
  X509_NAME_ENTRY *a;
  X509_NAME_ENTRY *pXVar3;
  bool bVar4;
  int n;
  stack_st_X509_NAME_ENTRY *sk;
  int inc;
  int i;
  X509_NAME_ENTRY *new_name;
  int set_local;
  int loc_local;
  X509_NAME_ENTRY *entry_local;
  X509_NAME *name_local;
  
  if (name != (X509_NAME *)0x0) {
    sk_00 = (stack_st_X509_NAME_ENTRY *)name->entries;
    sVar2 = sk_X509_NAME_ENTRY_num(sk_00);
    iVar1 = (int)sVar2;
    new_name._4_4_ = iVar1;
    if ((loc <= iVar1) && (new_name._4_4_ = loc, loc < 0)) {
      new_name._4_4_ = iVar1;
    }
    bVar4 = set == 0;
    name->modified = 1;
    if (set == -1) {
      if (new_name._4_4_ != 0) {
        pXVar3 = sk_X509_NAME_ENTRY_value(sk_00,(long)(new_name._4_4_ + -1));
        new_name._0_4_ = pXVar3->set;
      }
      else {
        new_name._0_4_ = 0;
      }
      bVar4 = new_name._4_4_ == 0 || bVar4;
    }
    else if (new_name._4_4_ < iVar1) {
      pXVar3 = sk_X509_NAME_ENTRY_value(sk_00,(long)new_name._4_4_);
      new_name._0_4_ = pXVar3->set;
    }
    else if (new_name._4_4_ == 0) {
      new_name._0_4_ = 0;
    }
    else {
      pXVar3 = sk_X509_NAME_ENTRY_value(sk_00,(long)(new_name._4_4_ + -1));
      new_name._0_4_ = pXVar3->set + 1;
    }
    a = X509_NAME_ENTRY_dup(ne);
    if (a != (X509_NAME_ENTRY *)0x0) {
      a->set = (int)new_name;
      sVar2 = sk_X509_NAME_ENTRY_insert(sk_00,(X509_NAME_ENTRY *)a,(long)new_name._4_4_);
      if (sVar2 != 0) {
        if (bVar4) {
          sVar2 = sk_X509_NAME_ENTRY_num(sk_00);
          while (sk._4_4_ = new_name._4_4_ + 1, sk._4_4_ < (int)sVar2) {
            pXVar3 = sk_X509_NAME_ENTRY_value(sk_00,(long)sk._4_4_);
            pXVar3->set = pXVar3->set + 1;
            new_name._4_4_ = sk._4_4_;
          }
        }
        return 1;
      }
    }
    if (a != (X509_NAME_ENTRY *)0x0) {
      X509_NAME_ENTRY_free(a);
    }
  }
  return 0;
}

Assistant:

int X509_NAME_add_entry(X509_NAME *name, const X509_NAME_ENTRY *entry, int loc,
                        int set) {
  X509_NAME_ENTRY *new_name = NULL;
  int i, inc;
  STACK_OF(X509_NAME_ENTRY) *sk;

  if (name == NULL) {
    return 0;
  }
  sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  if (loc > n) {
    loc = n;
  } else if (loc < 0) {
    loc = n;
  }

  inc = (set == 0);
  name->modified = 1;

  if (set == -1) {
    if (loc == 0) {
      set = 0;
      inc = 1;
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set;
    }
  } else {  // if (set >= 0)

    if (loc >= n) {
      if (loc != 0) {
        set = sk_X509_NAME_ENTRY_value(sk, loc - 1)->set + 1;
      } else {
        set = 0;
      }
    } else {
      set = sk_X509_NAME_ENTRY_value(sk, loc)->set;
    }
  }

  if ((new_name = X509_NAME_ENTRY_dup(entry)) == NULL) {
    goto err;
  }
  new_name->set = set;
  if (!sk_X509_NAME_ENTRY_insert(sk, new_name, loc)) {
    goto err;
  }
  if (inc) {
    n = (int)sk_X509_NAME_ENTRY_num(sk);
    for (i = loc + 1; i < n; i++) {
      sk_X509_NAME_ENTRY_value(sk, i)->set += 1;
    }
  }
  return 1;
err:
  if (new_name != NULL) {
    X509_NAME_ENTRY_free(new_name);
  }
  return 0;
}